

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionCodeGenJitTimeData.cpp
# Opt level: O0

void __thiscall
Js::FunctionCodeGenJitTimeData::FunctionCodeGenJitTimeData
          (FunctionCodeGenJitTimeData *this,FunctionInfo *functionInfo,EntryPointInfo *entryPoint,
          Var globalThis,uint16 profiledIterations,bool isInlined)

{
  nullptr_t local_78;
  nullptr_t local_70;
  nullptr_t local_68;
  nullptr_t local_60;
  nullptr_t local_58;
  nullptr_t local_50;
  nullptr_t local_48;
  nullptr_t local_40;
  nullptr_t local_38;
  byte local_2b;
  Type local_2a;
  bool isInlined_local;
  Var pvStack_28;
  uint16 profiledIterations_local;
  Var globalThis_local;
  EntryPointInfo *entryPoint_local;
  FunctionInfo *functionInfo_local;
  FunctionCodeGenJitTimeData *this_local;
  
  local_2b = isInlined;
  local_2a = profiledIterations;
  pvStack_28 = globalThis;
  globalThis_local = entryPoint;
  entryPoint_local = (EntryPointInfo *)functionInfo;
  functionInfo_local = (FunctionInfo *)this;
  Memory::WriteBarrierPtr<Js::FunctionInfo>::WriteBarrierPtr(&this->functionInfo,functionInfo);
  Memory::WriteBarrierPtr<Js::EntryPointInfo>::WriteBarrierPtr
            (&this->entryPointInfo,(EntryPointInfo *)globalThis_local);
  ObjTypeSpecFldInfoArray::ObjTypeSpecFldInfoArray(&this->objTypeSpecFldInfoArray);
  this->globalObjTypeSpecFldInfoCount = 0;
  local_38 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Memory::WriteBarrierPtr<ObjTypeSpecFldInfo>_>::WriteBarrierPtr
            (&this->globalObjTypeSpecFldInfoArray,&local_38);
  local_40 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Memory::WriteBarrierPtr<Js::FunctionCodeGenJitTimeData>_>::WriteBarrierPtr
            (&this->inlinees,&local_40);
  local_48 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Memory::WriteBarrierPtr<Js::FunctionCodeGenJitTimeData>_>::WriteBarrierPtr
            (&this->ldFldInlinees,&local_48);
  local_50 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Memory::WriteBarrierPtr<Js::FunctionCodeGenJitTimeData>_>::WriteBarrierPtr
            (&this->callbackInlinees,&local_50);
  local_58 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Memory::WriteBarrierPtr<Js::FunctionCodeGenJitTimeData>_>::WriteBarrierPtr
            (&this->callApplyTargetInlinees,&local_58);
  local_60 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::FunctionBody>_>::WriteBarrierPtr
            (&this->weakFuncRef,&local_60);
  Memory::WriteBarrierPtr<PolymorphicInlineCacheInfoIDL>::WriteBarrierPtr(&this->inlineeInfo);
  Memory::WriteBarrierPtr<PolymorphicInlineCacheInfoIDL>::WriteBarrierPtr(&this->selfInfo);
  Memory::WriteBarrierPtr<PolymorphicInlineCacheIDL>::WriteBarrierPtr
            (&this->polymorphicInlineCaches);
  Memory::WriteBarrierPtr<void>::WriteBarrierPtr(&this->globalThisObject,pvStack_28);
  this->inlineeCount = 0;
  this->ldFldInlineeCount = 0;
  local_68 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Js::FunctionCodeGenJitTimeData>::WriteBarrierPtr(&this->next,&local_68);
  this->isInlined = (Type)(local_2b & 1);
  this->isAggressiveInliningEnabled = false;
  this->profiledIterations = local_2a;
  local_70 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Js::FieldAccessStats>::WriteBarrierPtr(&this->inlineCacheStats,&local_70);
  Memory::WriteBarrierPtr<BVFixed>::WriteBarrierPtr(&this->inlineesBv);
  local_78 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<int>::WriteBarrierPtr(&this->sharedPropertyGuards,&local_78);
  this->sharedPropertyGuardCount = 0;
  return;
}

Assistant:

FunctionCodeGenJitTimeData::FunctionCodeGenJitTimeData(FunctionInfo *const functionInfo, EntryPointInfo *const entryPoint, Var globalThis, uint16 profiledIterations, bool isInlined) :
        functionInfo(functionInfo), entryPointInfo(entryPoint), globalObjTypeSpecFldInfoCount(0), globalObjTypeSpecFldInfoArray(nullptr),
        weakFuncRef(nullptr), inlinees(nullptr), inlineeCount(0), ldFldInlineeCount(0), isInlined(isInlined), isAggressiveInliningEnabled(false),
#ifdef FIELD_ACCESS_STATS
        inlineCacheStats(nullptr),
#endif
        next(nullptr),
        ldFldInlinees(nullptr),
        callbackInlinees(nullptr),
        callApplyTargetInlinees(nullptr),
        globalThisObject(globalThis),
        profiledIterations(profiledIterations),
        sharedPropertyGuards(nullptr),
        sharedPropertyGuardCount(0)
    {
    }